

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.cpp
# Opt level: O2

NodeRef __thiscall slang::IntervalMapDetails::Path::getLeftSibling(Path *this,uint32_t level)

{
  pointer pEVar1;
  int iVar2;
  NodeRef NVar3;
  int iVar4;
  ulong uVar5;
  ulong *puVar6;
  int iVar7;
  uint uVar8;
  bool bVar9;
  
  pEVar1 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  uVar5 = 0;
  iVar7 = -1;
  iVar2 = 0;
  do {
    iVar4 = iVar2;
    if (level - 1 == iVar4) goto LAB_00372cb5;
    uVar8 = level + iVar7;
    iVar7 = iVar7 + -1;
    iVar2 = iVar4 + 1;
  } while (pEVar1[uVar8].offset == 0);
  uVar5 = (ulong)(level - (iVar4 + 1));
LAB_00372cb5:
  if (pEVar1[uVar5].offset == 0) {
    NVar3.pip.value = (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)0;
  }
  else {
    puVar6 = (ulong *)((ulong)(pEVar1[uVar5].offset - 1) * 8 + (long)pEVar1[uVar5].node);
    while( true ) {
      NVar3.pip.value = (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)*puVar6;
      bVar9 = iVar4 == 0;
      iVar4 = iVar4 + -1;
      if (bVar9) break;
      puVar6 = (ulong *)(((ulong)NVar3.pip.value & 0xffffffffffffffc0) +
                        (ulong)(SUB84(NVar3.pip.value,0) & 0x3f) * 8);
    }
  }
  return (NodeRef)NVar3.pip.value;
}

Assistant:

NodeRef Path::getLeftSibling(uint32_t level) const {
    SLANG_ASSERT(level > 0);

    // Go up until we can go left.
    uint32_t l = level - 1;
    while (l && path[l].offset == 0)
        --l;

    // If we hit the root there is no left sibling.
    if (path[l].offset == 0)
        return NodeRef();

    // Start with left subtree and go down to the right
    // until we reach the original level.
    NodeRef node = path[l].childAt(path[l].offset - 1);
    for (++l; l != level; ++l)
        node = node.childAt(node.size() - 1);
    return node;
}